

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O2

void add_prefix_char(PCRE2_UCHAR16 chr,fast_forward_char_data *chars,BOOL last)

{
  PCRE2_UCHAR16 *pPVar1;
  byte bVar2;
  ulong uVar3;
  
  bVar2 = chars->count;
  if (bVar2 == 0) {
    chars->count = '\x01';
    chars->last_count = '\x01';
    chars->chars[0] = chr;
    return;
  }
  if (bVar2 != 0xff) {
    uVar3 = 0;
    do {
      if (bVar2 == uVar3) {
        if (4 < bVar2) {
          chars->count = 0xff;
          return;
        }
        chars->chars[bVar2] = chr;
        chars->count = bVar2 + 1;
        chars->last_count = chars->last_count + '\x01';
        return;
      }
      pPVar1 = chars->chars + uVar3;
      uVar3 = uVar3 + 1;
    } while (*pPVar1 != chr);
  }
  return;
}

Assistant:

static SLJIT_INLINE void add_prefix_char(PCRE2_UCHAR chr, fast_forward_char_data *chars, BOOL last)
{
sljit_u32 i, count = chars->count;

if (count == 255)
  return;

if (count == 0)
  {
  chars->count = 1;
  chars->chars[0] = chr;

  if (last)
    chars->last_count = 1;
  return;
  }

for (i = 0; i < count; i++)
  if (chars->chars[i] == chr)
    return;

if (count >= MAX_DIFF_CHARS)
  {
  chars->count = 255;
  return;
  }

chars->chars[count] = chr;
chars->count = count + 1;

if (last)
  chars->last_count++;
}